

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack23_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  
  auVar9 = *(undefined1 (*) [16])(in + 1);
  auVar10 = vpmovsxbd_avx2(ZEXT816(0x30200010008));
  uVar1 = *in;
  auVar5 = vpmovsxbd_avx(ZEXT416(0x4010100));
  uVar2 = in[0xb];
  *out = uVar1 & 0x7fffff;
  auVar10 = vpermi2d_avx512vl(auVar10,ZEXT1632(auVar9),ZEXT432(uVar1));
  auVar9 = vpshufd_avx(auVar9,0xb4);
  auVar9 = vpsllvd_avx2(auVar9,_DAT_001a1090);
  auVar9 = vpand_avx(auVar9,_DAT_001a10a0);
  auVar11 = vpbroadcastd_avx512vl();
  auVar10 = vpblendd_avx2(auVar10,auVar11,0x40);
  auVar14._8_4_ = 0x7fffff;
  auVar14._0_8_ = 0x7fffff007fffff;
  auVar14._12_4_ = 0x7fffff;
  auVar15._16_4_ = 0x7fffff;
  auVar15._0_16_ = auVar14;
  auVar15._20_4_ = 0x7fffff;
  auVar15._24_4_ = 0x7fffff;
  auVar15._28_4_ = 0x7fffff;
  auVar11 = vpbroadcastd_avx512vl();
  auVar10 = vpshufd_avx2(auVar10,0xa4);
  auVar7 = vpsrlvd_avx2(auVar10,_DAT_0019de00);
  auVar10 = vpermq_avx2(ZEXT1632(auVar9),0xd4);
  auVar10 = vpblendd_avx2(auVar10,auVar11,0x20);
  auVar11 = vpbroadcastd_avx512vl();
  uVar3 = *(ulong *)(in + 6);
  auVar11 = vpblendd_avx2(auVar10,auVar11,0x80);
  auVar12 = vpbroadcastd_avx512vl();
  auVar10._8_4_ = 0x7fff00;
  auVar10._0_8_ = 0x7fff00007fff00;
  auVar10._12_4_ = 0x7fff00;
  auVar10._16_4_ = 0x7fff00;
  auVar10._20_4_ = 0x7fff00;
  auVar10._24_4_ = 0x7fff00;
  auVar10._28_4_ = 0x7fff00;
  auVar10 = vpandd_avx512vl(auVar12,auVar10);
  uVar4 = *(ulong *)(in + 8);
  auVar12 = vpblendd_avx2(auVar7,auVar10,0x80);
  auVar10 = vpand_avx2(auVar7,auVar15);
  auVar11 = vpor_avx2(auVar12,auVar11);
  auVar10 = vpblendd_avx2(auVar11,auVar10,0x44);
  *(undefined1 (*) [32])(out + 1) = auVar10;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar4;
  auVar9 = vpsllvd_avx2(auVar13,_DAT_001a1550);
  auVar6._8_4_ = 0x7ffff8;
  auVar6._0_8_ = 0x7ff000007ffff8;
  auVar6._12_4_ = 0x7ff000;
  auVar8 = vpandq_avx512vl(auVar9,auVar6);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar3;
  auVar9 = vpermi2d_avx512vl(auVar5,auVar9,auVar13);
  auVar6 = vpsrlvd_avx2(auVar9,_DAT_001ada00);
  auVar9 = vpinsrd_avx(auVar14,((uint)(uVar3 >> 0x20) & 0x3f) << 0x11,0);
  uVar1 = in[10];
  auVar9 = vpunpcklqdq_avx(auVar9,auVar8);
  auVar5 = vpor_avx(auVar6,auVar9);
  auVar9 = vpand_avx(auVar6,auVar14);
  auVar9 = vpblendd_avx2(auVar5,auVar9,2);
  *(undefined1 (*) [16])(out + 9) = auVar9;
  out[0xd] = (uint)(uVar4 >> 0x2b) | (uVar1 & 3) << 0x15;
  out[0xe] = uVar1 >> 2 & 0x7fffff;
  out[0xf] = (uVar2 & 0xffff) << 7 | uVar1 >> 0x19;
  return in + 0xc;
}

Assistant:

const uint32_t *__fastunpack23_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 14)) << (23 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 5)) << (23 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 23);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 19)) << (23 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 10)) << (23 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 1)) << (23 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 23);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 15)) << (23 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 6)) << (23 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 23);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 20)) << (23 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 11)) << (23 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 2)) << (23 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 23);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 16)) << (23 - 16);
  out++;

  return in + 1;
}